

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O1

char * getobjname(Proto *p,int lastpc,int reg,char **name)

{
  uint i;
  bool bVar1;
  int pc;
  char *pcVar2;
  ulong uVar3;
  int local_34;
  int local_30;
  int local_2c;
  
  local_34 = lastpc;
  pcVar2 = basicgetobjname(p,&local_34,reg,name);
  pc = local_34;
  if (pcVar2 != (char *)0x0) {
    return pcVar2;
  }
  if ((long)local_34 == -1) goto LAB_0013ffa3;
  i = p->code[local_34];
  bVar1 = true;
  pcVar2 = (char *)(ulong)((i & 0x7f) - 0xb);
  switch(pcVar2) {
  case (char *)0x0:
    uVar3 = (ulong)(i >> 0x14 & 0xfffffff0);
    if (((&p->k->tt_)[uVar3] & 0xf) == 4) {
      pcVar2 = (char *)(*(long *)((long)&p->k->value_ + uVar3) + 0x18);
    }
    else {
      pcVar2 = "?";
    }
    *name = pcVar2;
    pcVar2 = isEnv(p,local_34,i,1);
    break;
  case (char *)0x1:
    local_30 = local_34;
    pcVar2 = basicgetobjname(p,&local_30,i >> 0x18,name);
    if ((pcVar2 == (char *)0x0) || (*pcVar2 != 'c')) {
LAB_0013ff02:
      pcVar2 = "?";
      goto LAB_0013ff09;
    }
    goto LAB_0013ff0c;
  case (char *)0x2:
    *name = "integer index";
    pcVar2 = "field";
    break;
  case (char *)0x3:
    uVar3 = (ulong)(i >> 0x14 & 0xfffffff0);
    if (((&p->k->tt_)[uVar3] & 0xf) != 4) goto LAB_0013ff02;
    pcVar2 = (char *)(*(long *)((long)&p->k->value_ + uVar3) + 0x18);
LAB_0013ff09:
    *name = pcVar2;
LAB_0013ff0c:
    bVar1 = false;
    pcVar2 = isEnv(p,pc,i,0);
  default:
    goto switchD_0013fe74_caseD_4;
  case (char *)0x9:
    if ((short)i < 0) {
      uVar3 = (ulong)((i >> 0x18) << 4);
      if (((&p->k->tt_)[uVar3] & 0xf) != 4) goto LAB_0013ff8b;
      pcVar2 = (char *)(*(long *)((long)&p->k->value_ + uVar3) + 0x18);
LAB_0013ff92:
      *name = pcVar2;
    }
    else {
      local_2c = local_34;
      pcVar2 = basicgetobjname(p,&local_2c,i >> 0x18,name);
      if ((pcVar2 == (char *)0x0) || (*pcVar2 != 'c')) {
LAB_0013ff8b:
        pcVar2 = "?";
        goto LAB_0013ff92;
      }
    }
    pcVar2 = "method";
  }
  bVar1 = false;
switchD_0013fe74_caseD_4:
  if (bVar1) {
LAB_0013ffa3:
    pcVar2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

static const char *getobjname (const Proto *p, int lastpc, int reg,
                               const char **name) {
  const char *kind = basicgetobjname(p, &lastpc, reg, name);
  if (kind != NULL)
    return kind;
  else if (lastpc != -1) {  /* could find instruction? */
    Instruction i = p->code[lastpc];
    OpCode op = GET_OPCODE(i);
    switch (op) {
      case OP_GETTABUP: {
        int k = GETARG_C(i);  /* key index */
        kname(p, k, name);
        return isEnv(p, lastpc, i, 1);
      }
      case OP_GETTABLE: {
        int k = GETARG_C(i);  /* key index */
        rname(p, lastpc, k, name);
        return isEnv(p, lastpc, i, 0);
      }
      case OP_GETI: {
        *name = "integer index";
        return "field";
      }
      case OP_GETFIELD: {
        int k = GETARG_C(i);  /* key index */
        kname(p, k, name);
        return isEnv(p, lastpc, i, 0);
      }
      case OP_SELF: {
        rkname(p, lastpc, i, name);
        return "method";
      }
      default: break;  /* go through to return NULL */
    }
  }
  return NULL;  /* could not find reasonable name */
}